

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  sqlite3 *psVar5;
  Select *p;
  FKey *pFVar6;
  ExprList *pEVar7;
  Expr *pExpr;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  char *zName;
  i64 iVar11;
  char *pcVar12;
  i64 iVar13;
  Table *pTVar14;
  Table *pTVar15;
  RenameToken *pToken_2;
  RenameToken *pRVar16;
  RenameToken **ppRVar17;
  RenameToken *pToken_1;
  RenameToken *pRVar18;
  RenameToken *pRVar19;
  long lVar20;
  RenameToken *pToken;
  RenameToken *pRVar21;
  TriggerStep *pTVar22;
  sqlite3_context *pCtx;
  Index *pIVar23;
  long lVar24;
  uint uVar25;
  Parse sParse;
  RenameCtx local_278;
  sqlite3 *local_250;
  sqlite3_context *local_248;
  i64 local_240;
  char *local_238;
  sqlite3_value **local_230;
  char *local_228;
  Walker local_220;
  sqlite3_xauth local_1f0;
  i64 local_1e8;
  char *local_1e0;
  Parse local_1d8;
  
  psVar5 = context->pOut->db;
  local_248 = context;
  pcVar10 = (char *)sqlite3ValueText(*argv,'\x01');
  local_228 = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  iVar11 = sqlite3VdbeIntValue(argv[5]);
  pcVar12 = (char *)sqlite3ValueText(argv[6],'\x01');
  local_1e8 = sqlite3VdbeIntValue(argv[7]);
  local_230 = argv;
  iVar13 = sqlite3VdbeIntValue(argv[8]);
  if (((int)iVar11 < 0 || pcVar12 == (char *)0x0) ||
      (zName == (char *)0x0 || pcVar10 == (char *)0x0)) {
    return;
  }
  local_1f0 = psVar5->xAuth;
  local_240 = iVar11;
  local_238 = pcVar10;
  local_1e0 = pcVar12;
  if (psVar5->noSharedCache == '\0') {
    btreeEnterAll(psVar5);
  }
  pcVar10 = local_228;
  pTVar14 = sqlite3FindTable(psVar5,zName,local_228);
  if ((pTVar14 == (Table *)0x0) || ((int)pTVar14->nCol <= (int)(uint)local_240)) {
    if (psVar5->noSharedCache != '\0') {
      return;
    }
    btreeLeaveAll(psVar5);
    return;
  }
  uVar25 = (uint)local_240 & 0x7fffffff;
  pcVar12 = pTVar14->aCol[uVar25].zCnName;
  local_278.pTab = (Table *)0x0;
  local_278.zOld = (char *)0x0;
  local_278.pList = (RenameToken *)0x0;
  local_278.iCol = 0xffffffff;
  if ((uint)local_240 != (int)pTVar14->iPKey) {
    local_278.iCol = (uint)local_240;
  }
  local_278.nList = 0;
  psVar5->xAuth = (sqlite3_xauth)0x0;
  local_250 = psVar5;
  iVar9 = renameParseSql(&local_1d8,pcVar10,psVar5,local_238,(int)iVar13);
  local_220.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_220.walkerDepth = 0;
  local_220.eCode = 0;
  local_220.mWFlags = 0;
  local_220.pParse = &local_1d8;
  local_220.xExprCallback = renameColumnExprCb;
  local_220.xSelectCallback = renameColumnSelectCb;
  pCtx = local_248;
  local_278.pTab = pTVar14;
  local_220.u.pNC = (NameContext *)&local_278;
  if (iVar9 != 0) goto LAB_001a1b9b;
  if (local_1d8.pNewTable == (Table *)0x0) {
    if (local_1d8.pNewIndex == (Index *)0x0) {
      local_220.u.pNC = (NameContext *)&local_278;
      iVar9 = renameResolveTrigger(&local_1d8);
      pCtx = local_248;
      if (iVar9 != 0) goto LAB_001a1b9b;
      pTVar22 = (local_1d8.pNewTrigger)->step_list;
      if (pTVar22 != (TriggerStep *)0x0) {
        do {
          if ((pTVar22->zTarget != (char *)0x0) &&
             (pTVar15 = sqlite3LocateTable(&local_1d8,0,pTVar22->zTarget,local_228),
             pTVar15 == pTVar14)) {
            if (pTVar22->pUpsert != (Upsert *)0x0) {
              renameColumnElistNames(&local_1d8,&local_278,pTVar22->pUpsert->pUpsertSet,pcVar12);
            }
            renameColumnIdlistNames(&local_1d8,&local_278,pTVar22->pIdList,pcVar12);
            renameColumnElistNames(&local_1d8,&local_278,pTVar22->pExprList,pcVar12);
          }
          pTVar22 = pTVar22->pNext;
        } while (pTVar22 != (TriggerStep *)0x0);
      }
      if (local_1d8.pTriggerTab == pTVar14) {
        renameColumnIdlistNames(&local_1d8,&local_278,(local_1d8.pNewTrigger)->pColumns,pcVar12);
      }
      renameWalkTrigger(&local_220,local_1d8.pNewTrigger);
    }
    else {
      local_220.u.pNC = (NameContext *)&local_278;
      sqlite3WalkExprList(&local_220,(local_1d8.pNewIndex)->aColExpr);
      if ((local_1d8.pNewIndex)->pPartIdxWhere != (Expr *)0x0) {
        sqlite3WalkExprNN(&local_220,(local_1d8.pNewIndex)->pPartIdxWhere);
      }
    }
  }
  else {
    if ((local_1d8.pNewTable)->eTabType == '\0') {
      if ((local_1d8.pNewTable)->zName != (char *)0x0) {
        lVar20 = 0;
        do {
          bVar1 = zName[lVar20];
          bVar2 = (local_1d8.pNewTable)->zName[lVar20];
          if (bVar1 == bVar2) {
            if ((ulong)bVar1 == 0) goto LAB_001a1c59;
          }
          else if (""[bVar1] != ""[bVar2]) break;
          lVar20 = lVar20 + 1;
        } while( true );
      }
      local_278.pTab = local_1d8.pNewTable;
      bVar8 = false;
      pTVar14 = local_1d8.pNewTable;
      local_220.u.pNC = (NameContext *)&local_278;
      goto LAB_001a1922;
    }
    local_220.u.pNC = (NameContext *)&local_278;
    if ((local_1d8.pNewTable)->eTabType == '\x02') {
      p = *(Select **)&(local_1d8.pNewTable)->u;
      p->selFlags = p->selFlags & 0xffdfffff;
      local_1d8.rc = 0;
      local_220.u.pNC = (NameContext *)&local_278;
      sqlite3SelectPrep(&local_1d8,p,(NameContext *)0x0);
      iVar9 = 7;
      if (local_250->mallocFailed == '\0') {
        iVar9 = local_1d8.rc;
      }
      pCtx = local_248;
      if (iVar9 != 0) goto LAB_001a1b9b;
      sqlite3WalkSelect(&local_220,p);
    }
  }
  goto LAB_001a1b71;
LAB_001a19f5:
  pcVar10 = pFVar6->aCol[lVar20].zCol;
  if ((pcVar10 != (char *)0x0) && (pcVar12 != (char *)0x0)) {
    lVar24 = 0;
    do {
      bVar1 = pcVar10[lVar24];
      if (bVar1 == pcVar12[lVar24]) {
        if ((ulong)bVar1 == 0) goto LAB_001a1a33;
      }
      else if (""[bVar1] != ""[(byte)pcVar12[lVar24]]) break;
      lVar24 = lVar24 + 1;
    } while( true );
  }
  goto LAB_001a1a7b;
LAB_001a1a33:
  if (local_1d8.pRename != (RenameToken *)0x0) {
    ppRVar17 = &local_1d8.pRename;
    pRVar19 = local_1d8.pRename;
    if ((char *)(local_1d8.pRename)->p != pcVar10) {
      do {
        pRVar18 = pRVar19;
        pRVar19 = pRVar18->pNext;
        if (pRVar19 == (RenameToken *)0x0) goto LAB_001a1a7b;
      } while ((char *)pRVar19->p != pcVar10);
      ppRVar17 = &pRVar18->pNext;
    }
    *ppRVar17 = pRVar19->pNext;
    pRVar19->pNext = pRVar16;
    iVar9 = iVar9 + 1;
    pRVar16 = pRVar19;
    local_278.pList = pRVar19;
    local_278.nList = iVar9;
  }
LAB_001a1a7b:
  lVar20 = lVar20 + 1;
  pRVar19 = pRVar16;
  if (lVar20 == iVar4) goto LAB_001a1a87;
  goto LAB_001a1952;
LAB_001a1c59:
  local_278.pTab = local_1d8.pNewTable;
  if (((int)(uint)local_240 < (int)(local_1d8.pNewTable)->nCol) &&
     (pcVar10 = (local_1d8.pNewTable)->aCol[uVar25].zCnName,
     local_1d8.pRename != (RenameToken *)0x0 && pcVar10 != (char *)0x0)) {
    pRVar16 = local_1d8.pRename;
    if ((char *)(local_1d8.pRename)->p == pcVar10) {
      ppRVar17 = &local_1d8.pRename;
    }
    else {
      do {
        pRVar19 = pRVar16;
        pRVar16 = pRVar19->pNext;
        if (pRVar16 == (RenameToken *)0x0) goto LAB_001a1cce;
      } while ((char *)pRVar16->p != pcVar10);
      ppRVar17 = &pRVar19->pNext;
    }
    *ppRVar17 = pRVar16->pNext;
    pRVar16->pNext = local_278.pList;
    local_278.nList = local_278.nList + 1;
    local_278.pList = pRVar16;
  }
LAB_001a1cce:
  if ((local_278.iCol < 0) && (local_1d8.pRename != (RenameToken *)0x0)) {
    pRVar16 = local_1d8.pRename;
    if ((i16 *)(local_1d8.pRename)->p == &(local_1d8.pNewTable)->iPKey) {
      ppRVar17 = &local_1d8.pRename;
    }
    else {
      do {
        pRVar19 = pRVar16;
        pRVar16 = pRVar19->pNext;
        if (pRVar16 == (RenameToken *)0x0) goto LAB_001a1d29;
      } while ((i16 *)pRVar16->p != &(local_1d8.pNewTable)->iPKey);
      ppRVar17 = &pRVar19->pNext;
    }
    *ppRVar17 = pRVar16->pNext;
    pRVar16->pNext = local_278.pList;
    local_278.nList = local_278.nList + 1;
    local_278.pList = pRVar16;
  }
LAB_001a1d29:
  local_220.u.pNC = (NameContext *)&local_278;
  sqlite3WalkExprList(&local_220,(local_1d8.pNewTable)->pCheck);
  pIVar23 = (local_1d8.pNewTable)->pIndex;
  if (pIVar23 != (Index *)0x0) {
    do {
      sqlite3WalkExprList(&local_220,pIVar23->aColExpr);
      pIVar23 = pIVar23->pNext;
    } while (pIVar23 != (Index *)0x0);
  }
  if (local_1d8.pNewIndex != (Index *)0x0) {
    pIVar23 = local_1d8.pNewIndex;
    do {
      sqlite3WalkExprList(&local_220,pIVar23->aColExpr);
      pIVar23 = pIVar23->pNext;
    } while (pIVar23 != (Index *)0x0);
  }
  bVar8 = true;
  pTVar14 = local_1d8.pNewTable;
  if (0 < (local_1d8.pNewTable)->nCol) {
    lVar24 = 0xc;
    lVar20 = 0;
    do {
      uVar3 = *(ushort *)((long)&pTVar14->aCol->zCnName + lVar24);
      if ((((uVar3 != 0) && (pTVar14->eTabType == '\0')) &&
          (pEVar7 = (pTVar14->u).tab.pDfltList, pEVar7 != (ExprList *)0x0)) &&
         (((int)(uint)uVar3 <= pEVar7->nExpr &&
          (pExpr = pEVar7->a[uVar3 - 1].pExpr, pExpr != (Expr *)0x0)))) {
        sqlite3WalkExprNN(&local_220,pExpr);
        pTVar14 = local_1d8.pNewTable;
      }
      lVar20 = lVar20 + 1;
      lVar24 = lVar24 + 0x10;
    } while (lVar20 < pTVar14->nCol);
  }
LAB_001a1922:
  pRVar16 = local_278.pList;
  iVar9 = local_278.nList;
  for (pFVar6 = (pTVar14->u).tab.pFKey; pFVar6 != (FKey *)0x0; pFVar6 = pFVar6->pNextFrom) {
    iVar4 = pFVar6->nCol;
    if (0 < (long)iVar4) {
      lVar20 = 0;
      pRVar19 = pRVar16;
LAB_001a1952:
      pRVar16 = pRVar19;
      if ((bVar8) &&
         (local_1d8.pRename != (RenameToken *)0x0 && pFVar6->aCol[lVar20].iFrom == (int)local_240))
      {
        ppRVar17 = &local_1d8.pRename;
        pRVar18 = local_1d8.pRename;
        pRVar16 = local_1d8.pRename;
        if ((sColMap *)(local_1d8.pRename)->p != pFVar6->aCol + lVar20) {
          do {
            pRVar21 = pRVar18;
            pRVar18 = pRVar21->pNext;
            pRVar16 = pRVar19;
            if (pRVar18 == (RenameToken *)0x0) goto LAB_001a19bc;
          } while ((sColMap *)pRVar18->p != pFVar6->aCol + lVar20);
          ppRVar17 = &pRVar21->pNext;
          pRVar16 = pRVar18;
        }
        *ppRVar17 = pRVar16->pNext;
        pRVar16->pNext = pRVar19;
        iVar9 = iVar9 + 1;
        local_278.pList = pRVar16;
        local_278.nList = iVar9;
      }
LAB_001a19bc:
      if (pFVar6->zTo != (char *)0x0) {
        lVar24 = 0;
        do {
          bVar1 = pFVar6->zTo[lVar24];
          if (bVar1 == zName[lVar24]) {
            if ((ulong)bVar1 == 0) goto LAB_001a19f5;
          }
          else if (""[bVar1] != ""[(byte)zName[lVar24]]) break;
          lVar24 = lVar24 + 1;
        } while( true );
      }
      goto LAB_001a1a7b;
    }
LAB_001a1a87:
  }
LAB_001a1b71:
  pCtx = local_248;
  iVar9 = renameEditSql(local_248,&local_278,local_238,local_1e0,(int)local_1e8);
LAB_001a1b9b:
  psVar5 = local_250;
  if (iVar9 != 0) {
    if ((iVar9 == 1) && ((local_250->flags & 0x10000001) == 1)) {
      sqlite3_result_value(pCtx,*local_230);
    }
    else if (local_1d8.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(pCtx,iVar9);
    }
    else {
      renameColumnParseError(pCtx,"",local_230[1],local_230[2],&local_1d8);
    }
  }
  renameParseCleanup(&local_1d8);
  pRVar16 = local_278.pList;
  while (pRVar16 != (RenameToken *)0x0) {
    pRVar19 = pRVar16->pNext;
    sqlite3DbFreeNN(psVar5,pRVar16);
    pRVar16 = pRVar19;
  }
  psVar5->xAuth = local_1f0;
  if (psVar5->noSharedCache == '\0') {
    btreeLeaveAll(psVar5);
  }
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zCnName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    if( IsView(sParse.pNewTable) ){
      Select *pSelect = sParse.pNewTable->u.view.pSelect;
      pSelect->selFlags &= ~SF_View;
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else if( IsOrdinaryTable(sParse.pNewTable) ){
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        if( iCol<sParse.pNewTable->nCol ){
          renameTokenFind(
              &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zCnName
          );
        }
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
        for(pIdx=sParse.pNewIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
        for(i=0; i<sParse.pNewTable->nCol; i++){
          Expr *pExpr = sqlite3ColumnExpr(sParse.pNewTable,
                                                  &sParse.pNewTable->aCol[i]);
          sqlite3WalkExpr(&sWalker, pExpr);
        }
#endif
      }

      assert( IsOrdinaryTable(sParse.pNewTable) );
      for(pFKey=sParse.pNewTable->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse);
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
      sqlite3_result_value(context, argv[0]);
    }else if( sParse.zErrMsg ){
      renameColumnParseError(context, "", argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}